

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

string * __thiscall
google::protobuf::(anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *action,
          MessageLite *message)

{
  string local_78 [32];
  string local_58 [55];
  undefined1 local_21;
  long *local_20;
  MessageLite *message_local;
  char *action_local;
  string *result;
  
  local_21 = 0;
  local_20 = (long *)action;
  message_local = (MessageLite *)this;
  action_local = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"Can\'t ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)message_local);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," message of type \"");
  (**(code **)(*local_20 + 0x10))(local_58);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,"\" because it is missing required fields: ");
  (**(code **)(*local_20 + 0x30))(local_78);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_78);
  std::__cxx11::string::~string(local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string InitializationErrorMessage(const char* action,
                                       const MessageLite& message) {
  // Note:  We want to avoid depending on strutil in the lite library, otherwise
  //   we'd use:
  //
  // return strings::Substitute(
  //   "Can't $0 message of type \"$1\" because it is missing required "
  //   "fields: $2",
  //   action, message.GetTypeName(),
  //   message.InitializationErrorString());

  std::string result;
  result += "Can't ";
  result += action;
  result += " message of type \"";
  result += message.GetTypeName();
  result += "\" because it is missing required fields: ";
  result += message.InitializationErrorString();
  return result;
}